

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pagerUnlockAndRollback(Pager *pPager)

{
  u8 uVar1;
  int iVar2;
  
  uVar1 = pPager->eState;
  if (uVar1 != '\0') {
    if (uVar1 == '\x01') {
      if (pPager->exclusiveMode == '\0') {
        pager_end_transaction(pPager,0,0);
      }
    }
    else if (uVar1 == '\x06') {
      if ((pPager->journalMode == '\x04') && (pPager->jfd->pMethods != (sqlite3_io_methods *)0x0)) {
        iVar2 = pPager->errCode;
        uVar1 = pPager->eLock;
        pPager->eState = '\0';
        pPager->eLock = '\x04';
        pPager->errCode = 0;
        pager_playback(pPager,1);
        pPager->errCode = iVar2;
        pPager->eLock = uVar1;
      }
    }
    else {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      sqlite3PagerRollback(pPager);
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
    }
  }
  pager_unlock(pPager);
  return;
}

Assistant:

static void pagerUnlockAndRollback(Pager *pPager){
  if( pPager->eState!=PAGER_ERROR && pPager->eState!=PAGER_OPEN ){
    assert( assert_pager_state(pPager) );
    if( pPager->eState>=PAGER_WRITER_LOCKED ){
      sqlite3BeginBenignMalloc();
      sqlite3PagerRollback(pPager);
      sqlite3EndBenignMalloc();
    }else if( !pPager->exclusiveMode ){
      assert( pPager->eState==PAGER_READER );
      pager_end_transaction(pPager, 0, 0);
    }
  }else if( pPager->eState==PAGER_ERROR
         && pPager->journalMode==PAGER_JOURNALMODE_MEMORY
         && isOpen(pPager->jfd)
  ){
    /* Special case for a ROLLBACK due to I/O error with an in-memory
    ** journal:  We have to rollback immediately, before the journal is
    ** closed, because once it is closed, all content is forgotten. */
    int errCode = pPager->errCode;
    u8 eLock = pPager->eLock;
    pPager->eState = PAGER_OPEN;
    pPager->errCode = SQLITE_OK;
    pPager->eLock = EXCLUSIVE_LOCK;
    pager_playback(pPager, 1);
    pPager->errCode = errCode;
    pPager->eLock = eLock;
  }
  pager_unlock(pPager);
}